

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O3

void Llb_MtrPrintMatrixStats(Llb_Mtr_t *p)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  void *__ptr;
  void *__ptr_00;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *format;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  size_t __nmemb;
  double dVar14;
  
  uVar1 = p->nRows;
  __nmemb = (size_t)(int)uVar1;
  __ptr = calloc(__nmemb,4);
  __ptr_00 = calloc(__nmemb,4);
  uVar6 = (ulong)uVar1;
  if ((long)__nmemb < 1) {
    dVar14 = 0.0;
  }
  else {
    piVar2 = p->pRowSums;
    uVar4 = 0;
    iVar5 = 0;
    do {
      if (piVar2[uVar4] != 0) {
        uVar11 = p->nCols;
        uVar8 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar10 = 0;
        }
        else {
          uVar10 = 0;
          do {
            if (p->pMatrix[uVar10][uVar4] == '\x01') goto LAB_007d2e85;
            uVar10 = uVar10 + 1;
          } while (uVar8 != uVar10);
          uVar10 = (ulong)uVar11;
        }
LAB_007d2e85:
        uVar11 = (int)uVar11 >> 0x1f & uVar11;
        uVar13 = uVar8;
        do {
          uVar13 = uVar13 - 1;
          uVar3 = (uint)uVar8;
          uVar12 = uVar11;
          uVar7 = uVar11 - 1;
          if ((int)uVar3 < 1) break;
          uVar7 = uVar3 - 1;
          uVar8 = (ulong)uVar7;
          uVar12 = uVar3;
        } while (p->pMatrix[uVar13 & 0xffffffff][uVar4] != '\x01');
        iVar9 = (int)uVar10;
        if ((int)uVar12 <= iVar9) {
          __assert_fail("iGrp1 <= iGrp2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Matrix.c"
                        ,0xfb,"void Llb_MtrPrintMatrixStats(Llb_Mtr_t *)");
        }
        *(int *)((long)__ptr + uVar4 * 4) = iVar9;
        *(uint *)((long)__ptr_00 + uVar4 * 4) = uVar7;
        iVar5 = (iVar5 - iVar9) + uVar7;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != uVar6);
    dVar14 = (double)iVar5;
  }
  uVar11 = p->nCols;
  if ((int)uVar11 < 1) {
    uVar7 = 0;
    uVar12 = 0;
  }
  else {
    uVar12 = 0;
    uVar7 = 0;
    uVar3 = 0;
    do {
      if ((int)uVar1 < 1) {
        if ((int)uVar12 <= (int)uVar7) {
          uVar12 = uVar7;
        }
      }
      else {
        uVar4 = 0;
        do {
          uVar7 = uVar7 + (*(uint *)((long)__ptr + uVar4 * 4) == uVar3);
          uVar4 = uVar4 + 1;
        } while (uVar6 != uVar4);
        if ((int)uVar12 <= (int)uVar7) {
          uVar12 = uVar7;
        }
        if (0 < (int)uVar1) {
          uVar4 = 0;
          do {
            uVar7 = uVar7 - (*(uint *)((long)__ptr_00 + uVar4 * 4) == uVar3);
            uVar4 = uVar4 + 1;
          } while (uVar6 != uVar4);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar11);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  iVar5 = 0x94d6ec;
  format = (char *)(ulong)uVar11;
  printf("[%4d x %4d]  Life-span =%6.2f  Max-cut =%5d\n",dVar14 / (double)(int)uVar1,format,uVar6,
         (ulong)uVar12);
  if (uVar7 == 0) {
    return;
  }
  Abc_Print(iVar5,format,(ulong)uVar7);
  return;
}

Assistant:

void Llb_MtrPrintMatrixStats( Llb_Mtr_t * p )
{
    int iVar, iGrp, iGrp1, iGrp2, Span = 0, nCutSize = 0, nCutSizeMax = 0;
    int * pGrp1 = ABC_CALLOC( int, p->nRows ); 
    int * pGrp2 = ABC_CALLOC( int, p->nRows ); 
    for ( iVar = 0; iVar < p->nRows; iVar++ )
    {
        if ( p->pRowSums[iVar] == 0 )
            continue;
        for ( iGrp1 = 0; iGrp1 < p->nCols; iGrp1++ )
            if ( p->pMatrix[iGrp1][iVar] == 1 )
                break;
        for ( iGrp2 = p->nCols - 1; iGrp2 >= 0; iGrp2-- )
            if ( p->pMatrix[iGrp2][iVar] == 1 )
                break;
        assert( iGrp1 <= iGrp2 );
        pGrp1[iVar] = iGrp1;
        pGrp2[iVar] = iGrp2;
        Span += iGrp2 - iGrp1;
    }
    // compute span
    for ( iGrp = 0; iGrp < p->nCols; iGrp++ )
    {
        for ( iVar = 0; iVar < p->nRows; iVar++ )
            if ( pGrp1[iVar] == iGrp )
                nCutSize++;
        if ( nCutSizeMax < nCutSize )
            nCutSizeMax = nCutSize;
        for ( iVar = 0; iVar < p->nRows; iVar++ )
            if ( pGrp2[iVar] == iGrp )
                nCutSize--;
    }
    ABC_FREE( pGrp1 );
    ABC_FREE( pGrp2 );
    printf( "[%4d x %4d]  Life-span =%6.2f  Max-cut =%5d\n", 
        p->nCols, p->nRows, 1.0*Span/p->nRows, nCutSizeMax );
    if ( nCutSize )
        Abc_Print( -1, "Cut size is not zero (%d).\n", nCutSize );
}